

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O1

void CB_EXPLORE_ADF::predict_or_learn_bag<false>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  pointer *ppfVar1;
  vector<float,_std::allocator<float>_> *this;
  polyprediction *this_00;
  pointer ppeVar2;
  pointer ppeVar3;
  example *ec;
  pointer pfVar4;
  iterator __position;
  action_score *paVar5;
  bool bVar6;
  action_score *paVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  uint32_t uVar13;
  v_array<ACTION_SCORE::action_score> *__range3;
  uint uVar14;
  ulong uVar15;
  action_score local_68;
  action_score *local_60;
  multi_ex *local_58;
  ulong local_50;
  multi_learner *local_48;
  pointer_____offset_0x10___ *local_40;
  action_score *local_38;
  
  ppeVar2 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  ec = *ppeVar2;
  this_00 = &ec->pred;
  local_58 = examples;
  local_48 = base;
  bVar6 = CB::ec_is_example_header(ec);
  uVar14 = (int)((ulong)((long)ppeVar3 - (long)ppeVar2) >> 3) - (uint)bVar6;
  if (uVar14 == 0) {
    v_array<ACTION_SCORE::action_score>::clear
              ((v_array<ACTION_SCORE::action_score> *)&this_00->scalars);
    return;
  }
  pfVar4 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar4) {
    (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = pfVar4;
  }
  iVar12 = uVar14 + (uVar14 == 0);
  do {
    local_68 = (action_score)((ulong)local_68 & 0xffffffff00000000);
    __position._M_current =
         (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&data->scores,__position,(float *)&local_68);
    }
    else {
      *__position._M_current = 0.0;
      ppfVar1 = &(data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppfVar1 = *ppfVar1 + 1;
    }
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  this = &data->top_actions;
  local_50 = (ulong)uVar14;
  local_68 = (action_score)((ulong)local_68 & 0xffffffff00000000);
  std::vector<float,_std::allocator<float>_>::_M_fill_assign
            (this,local_50,(value_type_conflict4 *)&local_68);
  test_adf_sequence(local_58);
  if (data->bag_size != 0) {
    uVar15 = 0;
    do {
      LEARNER::multiline_learn_or_predict<false>(local_48,local_58,data->offset,(uint32_t)uVar15);
      paVar5 = (action_score *)(ec->pred).scalars._end;
      for (paVar7 = (ec->pred).a_s._begin; paVar7 != paVar5; paVar7 = paVar7 + 1) {
        pfVar4 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar4[paVar7->action] = paVar7->score + pfVar4[paVar7->action];
      }
      if (data->first_only == false) {
        paVar7 = (ec->pred).a_s._begin;
        lVar10 = (long)(ec->pred).scalars._end - (long)paVar7;
        if (lVar10 == 0) {
          uVar9 = 0;
        }
        else {
          uVar11 = lVar10 >> 3;
          uVar8 = 1;
          uVar9 = uVar8;
          if (1 < uVar11) {
            do {
              uVar9 = uVar8;
              if ((paVar7[uVar8].score != paVar7->score) ||
                 (NAN(paVar7[uVar8].score) || NAN(paVar7->score))) break;
              uVar8 = uVar8 + 1;
              uVar9 = uVar11;
            } while (uVar11 != uVar8);
          }
        }
        if (uVar9 != 0) {
          uVar8 = 0;
          do {
            pfVar4 = (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pfVar4[(uint)(this_00->scalars)._begin[uVar8 * 2]] =
                 pfVar4[(uint)(this_00->scalars)._begin[uVar8 * 2]] + 1.0 / (float)uVar9;
            uVar8 = uVar8 + 1;
          } while (uVar9 != uVar8);
        }
      }
      else {
        uVar14 = ((this_00->a_s)._begin)->action;
        pfVar4 = (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar4[uVar14] = pfVar4[uVar14] + 1.0;
      }
      uVar15 = (ulong)((uint32_t)uVar15 + 1);
    } while (uVar15 < data->bag_size);
  }
  v_array<ACTION_SCORE::action_score>::clear(&data->action_probs);
  if ((data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_68.action = 0;
    local_68.score = 0.0;
    do {
      uVar13 = local_68.action;
      v_array<ACTION_SCORE::action_score>::push_back(&data->action_probs,&local_68);
      local_68.action = uVar13 + 1;
      local_68.score = 0.0;
    } while ((ulong)local_68 <
             (ulong)((long)(data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2));
  }
  local_60 = (data->action_probs)._begin;
  local_38 = (data->action_probs)._end;
  local_68 = (action_score)
             &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_40 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::
  generate_bag<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,ACTION_SCORE::score_iterator>
            ((data->top_actions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,
             (data->top_actions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_68,&local_40);
  local_60 = (data->action_probs)._begin;
  local_38 = (data->action_probs)._end;
  local_68 = (action_score)
             &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_40 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
            (data->epsilon,1,&local_68,&local_40);
  do_sort(data);
  lVar10 = 0;
  do {
    *(undefined8 *)((long)(this_00->scalars)._begin + lVar10) =
         *(undefined8 *)((long)&((data->action_probs)._begin)->action + lVar10);
    lVar10 = lVar10 + 8;
  } while ((local_50 + (local_50 == 0)) * 8 != lVar10);
  return;
}

Assistant:

void predict_or_learn_bag(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Randomize over predictions from a base set of predictors
  v_array<action_score>& preds = examples[0]->pred.a_s;
  uint32_t num_actions = (uint32_t)examples.size();
  if (CB::ec_is_example_header(*examples[0]))
    num_actions--;
  if (num_actions == 0)
  {
    preds.clear();
    return;
  }

  data.scores.clear();
  for (uint32_t i = 0; i < num_actions; i++) data.scores.push_back(0.f);
  vector<float>& top_actions = data.top_actions;
  top_actions.assign(num_actions, 0);
  bool test_sequence = test_adf_sequence(examples) == nullptr;
  for (uint32_t i = 0; i < data.bag_size; i++)
  {
    // avoid updates to the random num generator
    // for greedify, always update first policy once
    uint32_t count = is_learn ? ((data.greedify && i == 0) ? 1 : BS::weight_gen(*data.all)) : 0;

    if (is_learn && count > 0 && !test_sequence)
      multiline_learn_or_predict<true>(base, examples, data.offset, i);
    else
      multiline_learn_or_predict<false>(base, examples, data.offset, i);

    assert(preds.size() == num_actions);
    for (auto e : preds) data.scores[e.action] += e.score;

    if (!data.first_only)
    {
      size_t tied_actions = fill_tied(data, preds);
      for (size_t i = 0; i < tied_actions; ++i) top_actions[preds[i].action] += 1.f / tied_actions;
    }
    else
      top_actions[preds[0].action] += 1.f;
    if (is_learn && !test_sequence)
      for (uint32_t j = 1; j < count; j++) multiline_learn_or_predict<true>(base, examples, data.offset, i);
  }

  data.action_probs.clear();
  for (uint32_t i = 0; i < data.scores.size(); i++) data.action_probs.push_back({i, 0.});

  // generate distribution over actions
  generate_bag(
      begin(data.top_actions), end(data.top_actions), begin_scores(data.action_probs), end_scores(data.action_probs));

  enforce_minimum_probability(data.epsilon, true, begin_scores(data.action_probs), end_scores(data.action_probs));

  do_sort(data);

  for (size_t i = 0; i < num_actions; i++) preds[i] = data.action_probs[i];
}